

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_entry.h
# Opt level: O1

void __thiscall
CTxMemPoolEntry::CTxMemPoolEntry
          (CTxMemPoolEntry *this,CTransactionRef *tx,CAmount fee,int64_t time,uint entry_height,
          uint64_t entry_sequence,bool spends_coinbase,int64_t sigops_cost,LockPoints lp)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  CTransaction *tx_00;
  element_type *peVar3;
  pointer pCVar4;
  pointer pCVar5;
  pointer pvVar6;
  pointer puVar7;
  pointer puVar8;
  uint uVar9;
  SizeComputer SVar10;
  int iVar11;
  int64_t iVar12;
  long lVar13;
  ulong uVar15;
  pointer pvVar16;
  pointer pCVar17;
  long lVar18;
  size_t sVar20;
  ulong uVar21;
  const_iterator it;
  pointer pCVar22;
  long in_FS_OFFSET;
  SizeComputer local_50;
  ParamsStream<SizeComputer_&,_TransactionSerParams> local_48;
  long local_38;
  ulong uVar14;
  ulong uVar19;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  p_Var1 = &(this->m_parents)._M_t._M_impl.super__Rb_tree_header;
  (this->m_parents)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_parents)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_parents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_parents)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_parents)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_children)._M_t._M_impl.super__Rb_tree_header;
  (this->m_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_children)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->nFee = fee;
  tx_00 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_50.nSize = 0;
  local_48.m_params = &::TX_NO_WITNESS;
  local_48.m_substream = &local_50;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            (tx_00,&local_48,&::TX_NO_WITNESS);
  SVar10.nSize = local_50.nSize;
  local_50.nSize = 0;
  local_48.m_params = &::TX_WITH_WITNESS;
  local_48.m_substream = &local_50;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            (tx_00,&local_48,&::TX_WITH_WITNESS);
  iVar11 = (int)SVar10.nSize * 3 + (int)local_50.nSize;
  this->nTxWeight = iVar11;
  peVar3 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar3 == (element_type *)0x0) {
    sVar20 = 0;
  }
  else {
    pCVar4 = (peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pCVar17 = (peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar21 = 0;
    pCVar5 = (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    uVar15 = (long)pCVar4 + (0x1f - (long)pCVar17) & 0xfffffffffffffff0;
    if (pCVar4 == pCVar17) {
      uVar15 = uVar21;
    }
    pCVar22 = (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar19 = (long)pCVar5 + (0x1f - (long)pCVar22) & 0xfffffffffffffff0;
    if (pCVar5 == pCVar22) {
      uVar19 = uVar21;
    }
    lVar18 = uVar19 + uVar15;
    for (; pCVar22 !=
           (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish; pCVar22 = pCVar22 + 1) {
      pvVar6 = *(pointer *)
                ((long)&(pCVar22->scriptWitness).stack.
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_impl.super__Vector_impl_data + 0x10);
      pvVar16 = (pCVar22->scriptWitness).stack.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar15 = (long)pvVar6 + (0x1f - (long)pvVar16) & 0xfffffffffffffff0;
      if (pvVar6 == pvVar16) {
        uVar15 = uVar21;
      }
      uVar19 = (ulong)(pCVar22->scriptSig).super_CScriptBase._union.indirect_contents.capacity;
      if ((pCVar22->scriptSig).super_CScriptBase._size < 0x1d) {
        uVar19 = uVar21;
      }
      uVar14 = uVar19 + 0x1f & 0x1fffffff0;
      if ((int)uVar19 == 0) {
        uVar14 = uVar21;
      }
      lVar13 = uVar14 + uVar15;
      for (; pvVar16 !=
             *(pointer *)
              ((long)&(pCVar22->scriptWitness).stack.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data + 8); pvVar16 = pvVar16 + 1) {
        puVar7 = (pvVar16->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        puVar8 = (pvVar16->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar15 = 0;
        if (puVar7 != puVar8) {
          uVar15 = (ulong)(puVar7 + (0x1f - (long)puVar8)) & 0xfffffffffffffff0;
        }
        lVar13 = lVar13 + uVar15;
      }
      lVar18 = lVar18 + lVar13;
    }
    for (; pCVar17 !=
           (peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_finish; pCVar17 = pCVar17 + 1) {
      uVar9 = (pCVar17->scriptPubKey).super_CScriptBase._union.indirect_contents.capacity;
      if ((pCVar17->scriptPubKey).super_CScriptBase._size < 0x1d) {
        uVar9 = 0;
      }
      uVar15 = 0;
      if (uVar9 != 0) {
        uVar15 = (ulong)uVar9 + 0x1f & 0x1fffffff0;
      }
      lVar18 = lVar18 + uVar15;
    }
    sVar20 = lVar18 + 0xc0;
  }
  this->nUsageSize = sVar20;
  this->nTime = time;
  this->entry_sequence = entry_sequence;
  this->entryHeight = entry_height;
  this->spendsCoinbase = spends_coinbase;
  this->sigOpCost = sigops_cost;
  this->m_modified_fee = this->nFee;
  (this->lockPoints).height = lp.height;
  *(undefined4 *)&(this->lockPoints).field_0x4 = lp._4_4_;
  (this->lockPoints).time = lp.time;
  (this->lockPoints).maxInputBlock = lp.maxInputBlock;
  this->m_count_with_descendants = 1;
  iVar12 = GetVirtualTransactionSize((long)iVar11,sigops_cost,nBytesPerSigOp);
  this->nSizeWithDescendants = (long)(int)iVar12;
  this->nModFeesWithDescendants = this->nFee;
  this->m_count_with_ancestors = 1;
  iVar12 = GetVirtualTransactionSize((long)this->nTxWeight,this->sigOpCost,nBytesPerSigOp);
  this->nSizeWithAncestors = (long)(int)iVar12;
  this->nModFeesWithAncestors = this->nFee;
  this->nSigOpCostWithAncestors = this->sigOpCost;
  (this->m_epoch_marker).m_marker = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CTxMemPoolEntry(const CTransactionRef& tx, CAmount fee,
                    int64_t time, unsigned int entry_height, uint64_t entry_sequence,
                    bool spends_coinbase,
                    int64_t sigops_cost, LockPoints lp)
        : tx{tx},
          nFee{fee},
          nTxWeight{GetTransactionWeight(*tx)},
          nUsageSize{RecursiveDynamicUsage(tx)},
          nTime{time},
          entry_sequence{entry_sequence},
          entryHeight{entry_height},
          spendsCoinbase{spends_coinbase},
          sigOpCost{sigops_cost},
          m_modified_fee{nFee},
          lockPoints{lp},
          nSizeWithDescendants{GetTxSize()},
          nModFeesWithDescendants{nFee},
          nSizeWithAncestors{GetTxSize()},
          nModFeesWithAncestors{nFee},
          nSigOpCostWithAncestors{sigOpCost} {}